

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O3

int AF_A_FreezeDeathChunks(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  player_t *ppVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 extraout_var;
  PClass *pPVar13;
  PClassActor *pPVar14;
  AActor *pAVar15;
  APlayerPawn *this;
  PClass *pPVar16;
  FState *pFVar17;
  VMValue *pVVar18;
  char *__assertion;
  AActor *ent;
  FString *this_00;
  long lVar19;
  bool bVar20;
  bool bVar21;
  DVector2 v;
  FName local_9c;
  anon_union_16_5_cf148060_for_VMValue_0 local_98;
  AActor *local_88;
  undefined4 local_80;
  undefined1 local_7c;
  FString local_78;
  undefined4 local_70;
  char local_6c [12];
  AActor *local_60;
  VMFrameStack *local_58;
  double local_50;
  double local_48;
  double local_40;
  FName local_38;
  FSoundID local_34;
  undefined4 extraout_var_00;
  
  pPVar16 = AActor::RegistrationInfo.MyClass;
  local_58 = stack;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00603534;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00603524;
  ent = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (ent == (AActor *)0x0) goto LAB_00602e59;
    pPVar13 = (ent->super_DThinker).super_DObject.Class;
    if (pPVar13 == (PClass *)0x0) {
      iVar8 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
      pPVar13 = (PClass *)CONCAT44(extraout_var,iVar8);
      (ent->super_DThinker).super_DObject.Class = pPVar13;
    }
    bVar20 = pPVar13 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar20;
    bVar21 = pPVar13 == pPVar16;
    if (!bVar21 && !bVar20) {
      do {
        pPVar13 = pPVar13->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar13 != (PClass *)0x0);
        if (pPVar13 == pPVar16) break;
      } while (pPVar13 != (PClass *)0x0);
    }
    pVVar18 = (VMValue *)(ulong)(bVar21 || bVar20);
    uVar12 = (uint)bVar20;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00603534;
    }
  }
  else {
    if (ent != (AActor *)0x0) goto LAB_00603524;
LAB_00602e59:
    ent = (AActor *)0x0;
    pVVar18 = param;
    uVar12 = numparam;
  }
  pPVar16 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar2 = param[1].field_0.field_3.Type;
    if (VVar2 != 0xff) {
      if (VVar2 != '\x03') {
LAB_00603524:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_00603534;
      }
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar3 != (undefined8 *)0x0) {
          pPVar13 = (PClass *)puVar3[1];
          if (pPVar13 == (PClass *)0x0) {
            pPVar13 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar18,uVar12,ret);
            puVar3[1] = pPVar13;
          }
          bVar20 = pPVar13 != (PClass *)0x0;
          if (pPVar13 != pPVar16 && bVar20) {
            do {
              pPVar13 = pPVar13->ParentClass;
              bVar20 = pPVar13 != (PClass *)0x0;
              if (pPVar13 == pPVar16) break;
            } while (pPVar13 != (PClass *)0x0);
          }
          if (!bVar20) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_00603534;
          }
        }
      }
      else if (puVar3 != (undefined8 *)0x0) goto LAB_00603524;
    }
    if (((2 < numparam) && (VVar2 = param[2].field_0.field_3.Type, VVar2 != 0xff)) &&
       ((VVar2 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_00603534:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                    ,0x10f,
                    "int AF_A_FreezeDeathChunks(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  dVar1 = (ent->Vel).X;
  if ((((((dVar1 != 0.0) || (NAN(dVar1))) || (dVar1 = (ent->Vel).Y, dVar1 != 0.0)) ||
       ((NAN(dVar1) || (dVar1 = (ent->Vel).Z, dVar1 != 0.0)))) || (NAN(dVar1))) &&
     (((ent->flags6).Value & 0x20000) == 0)) {
    ent->tics = 0x69;
    return 0;
  }
  (ent->Vel).X = 0.0;
  (ent->Vel).Y = 0.0;
  (ent->Vel).Z = 0.0;
  local_34.ID = S_FindSound("misc/icebreak");
  S_Sound(ent,4,&local_34,1.0,1.0);
  iVar9 = (int)(ent->radius * ent->Height);
  iVar8 = iVar9 + 0x1f;
  if (-1 < iVar9) {
    iVar8 = iVar9;
  }
  uVar12 = iVar8 >> 5;
  if (iVar8 >> 5 < 5) {
    uVar12 = 4;
  }
  uVar10 = FRandom::GenRand32(&pr_freeze);
  uVar11 = FRandom::GenRand32(&pr_freeze);
  iVar9 = (int)((uVar10 & 0xff) - (uVar11 & 0xff)) % (int)(uVar12 >> 2) + uVar12;
  iVar8 = 0x18;
  local_60 = ent;
  if (0x18 < iVar9) {
    iVar8 = iVar9;
  }
  do {
    uVar12 = FRandom::GenRand32(&pr_freeze);
    local_40 = (double)(int)((uVar12 & 0xff) - 0x80) * ent->radius * 0.0078125;
    uVar12 = FRandom::GenRand32(&pr_freeze);
    local_48 = (double)(int)((uVar12 & 0xff) - 0x80) * ent->radius * 0.0078125;
    uVar12 = FRandom::GenRand32(&pr_freeze);
    local_50 = ((double)(uVar12 & 0xff) * ent->Height) / 255.0;
    iVar9 = FName::NameManager::FindName(&FName::NameData,"IceChunk",false);
    P_GetOffsetPosition((ent->__Pos).X,(ent->__Pos).Y,local_40,local_48);
    local_88 = (AActor *)(local_50 + (ent->__Pos).Z);
    local_9c.Index = iVar9;
    pPVar14 = ClassForSpawn(&local_9c);
    pAVar15 = AActor::StaticSpawn(pPVar14,(DVector3 *)&local_98.field_1,ALLOW_REPLACE,false);
    if (pAVar15 != (AActor *)0x0) {
      pFVar17 = pAVar15->SpawnState;
      uVar12 = FRandom::GenRand32(&pr_freeze);
      AActor::SetState(pAVar15,pFVar17 + (byte)((char)uVar12 + (char)((uVar12 & 0xff) / 3) * -3),
                       false);
      uVar12 = FRandom::GenRand32(&pr_freeze);
      uVar10 = FRandom::GenRand32(&pr_freeze);
      (pAVar15->Vel).X = (double)(int)((uVar12 & 0xff) - (uVar10 & 0xff)) * 0.0078125;
      uVar12 = FRandom::GenRand32(&pr_freeze);
      ent = local_60;
      uVar10 = FRandom::GenRand32(&pr_freeze);
      dVar1 = (double)(int)((uVar12 & 0xff) - (uVar10 & 0xff)) * 0.0078125;
      dVar7 = (((pAVar15->__Pos).Z - (ent->__Pos).Z) / ent->Height) * 4.0;
      auVar5._8_4_ = SUB84(dVar7,0);
      auVar5._0_8_ = dVar1;
      auVar5._12_4_ = (int)((ulong)dVar7 >> 0x20);
      (pAVar15->Vel).Y = dVar1;
      (pAVar15->Vel).Z = (double)auVar5._8_8_;
      local_98._8_5_ = 0x300000001;
      local_80 = 1;
      local_7c = 3;
      local_78.Chars = (char *)0x0;
      local_70 = 8;
      local_6c[0] = 3;
      local_98.field_1.a = pAVar15;
      local_88 = pAVar15;
      VMFrameStack::Call(local_58,&A_IceSetTics_VMPtr->super_VMFunction,(VMValue *)&local_98.field_1
                         ,3,(VMReturn *)0x0,0,(VMException **)0x0);
      lVar19 = -0x30;
      this_00 = &local_78;
      do {
        if (*(char *)((long)&this_00[1].Chars + 4) == '\x02') {
          FString::~FString(this_00);
        }
        this_00 = this_00 + -2;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0);
      pAVar15->RenderStyle = ent->RenderStyle;
      pAVar15->Alpha = ent->Alpha;
    }
    bVar20 = 0 < iVar8;
    iVar8 = iVar8 + -1;
  } while (bVar20);
  if (ent->player == (player_t *)0x0) goto LAB_006034d3;
  local_9c.Index = FName::NameManager::FindName(&FName::NameData,"IceChunkHead",false);
  local_88 = (AActor *)(ent->player->mo->ViewHeight + (ent->__Pos).Z);
  local_98.field_1.a = (void *)(ent->__Pos).X;
  local_98._8_8_ = (ent->__Pos).Y;
  pPVar14 = ClassForSpawn(&local_9c);
  this = (APlayerPawn *)
         AActor::StaticSpawn(pPVar14,(DVector3 *)&local_98.field_1,ALLOW_REPLACE,false);
  if (this == (APlayerPawn *)0x0) goto LAB_006034d3;
  uVar12 = FRandom::GenRand32(&pr_freeze);
  uVar10 = FRandom::GenRand32(&pr_freeze);
  ((DVector3 *)(&(this->super_AActor).super_DThinker + 3))->X =
       (double)(int)((uVar12 & 0xff) - (uVar10 & 0xff)) * 0.0078125;
  uVar12 = FRandom::GenRand32(&pr_freeze);
  uVar10 = FRandom::GenRand32(&pr_freeze);
  dVar1 = (double)(int)((uVar12 & 0xff) - (uVar10 & 0xff)) * 0.0078125;
  dVar7 = (((pAVar15->__Pos).Z - (ent->__Pos).Z) / ent->Height) * 4.0;
  auVar6._8_4_ = SUB84(dVar7,0);
  auVar6._0_8_ = dVar1;
  auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
  (this->super_AActor).Vel.Y = dVar1;
  (this->super_AActor).Vel.Z = (double)auVar6._8_8_;
  *(int *)((long)(&(this->super_AActor).super_DThinker + 8) + 0xc) = ent->health;
  *(double *)((long)(&(this->super_AActor).super_DThinker + 2) + 0x20) = (ent->Angles).Yaw.Degrees;
  pPVar13 = APlayerPawn::RegistrationInfo.MyClass;
  pPVar16 = (this->super_AActor).super_DThinker.super_DObject.Class;
  if (pPVar16 == (PClass *)0x0) {
    iVar8 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
    pPVar16 = (PClass *)CONCAT44(extraout_var_00,iVar8);
    (this->super_AActor).super_DThinker.super_DObject.Class = pPVar16;
  }
  bVar20 = pPVar16 != (PClass *)0x0;
  if (pPVar16 != pPVar13 && bVar20) {
    do {
      pPVar16 = pPVar16->ParentClass;
      bVar20 = pPVar16 != (PClass *)0x0;
      if (pPVar16 == pPVar13) break;
    } while (pPVar16 != (PClass *)0x0);
  }
  if (bVar20) {
    ppVar4 = ent->player;
    *(player_t **)((long)(&(this->super_AActor).super_DThinker + 9) + 8) = ppVar4;
    ppVar4->mo = this;
    ent->player = (player_t *)0x0;
    AActor::ObtainInventory((AActor *)this,ent);
  }
  (this->super_AActor).Angles.Pitch.Degrees = 0.0;
  (this->super_AActor).RenderStyle = ent->RenderStyle;
  (this->super_AActor).Alpha = ent->Alpha;
  ppVar4 = (this->super_AActor).player;
  pAVar15 = (ppVar4->camera).field_0.p;
  if (pAVar15 == (AActor *)0x0) {
LAB_006034be:
    pAVar15 = (AActor *)0x0;
  }
  else if (((pAVar15->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (ppVar4->camera).field_0.p = (AActor *)0x0;
    goto LAB_006034be;
  }
  if (pAVar15 == ent) {
    (((this->super_AActor).player)->camera).field_0.p = (AActor *)this;
  }
LAB_006034d3:
  if (((ent->flags4).Value & 8) != 0) {
    A_BossDeath(ent);
  }
  A_Unblock(ent,true);
  local_38.Index = 1;
  pFVar17 = AActor::FindState(ent,&local_38);
  AActor::SetState(ent,pFVar17,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeathChunks)
{
	PARAM_ACTION_PROLOGUE;

	int i;
	int numChunks;
	AActor *mo;
	
	if (!self->Vel.isZero() && !(self->flags6 & MF6_SHATTERING))
	{
		self->tics = 3*TICRATE;
		return 0;
	}
	self->Vel.Zero();
	S_Sound (self, CHAN_BODY, "misc/icebreak", 1, ATTN_NORM);

	// [RH] In Hexen, this creates a random number of shards (range [24,56])
	// with no relation to the size of the self shattering. I think it should
	// base the number of shards on the size of the dead thing, so bigger
	// things break up into more shards than smaller things.
	// An actor with radius 20 and height 64 creates ~40 chunks.
	numChunks = MAX<int>(4, int(self->radius * self->Height)/32);
	i = (pr_freeze.Random2()) % (numChunks/4);
	for (i = MAX (24, numChunks + i); i >= 0; i--)
	{
		double xo = (pr_freeze() - 128)*self->radius / 128;
		double yo = (pr_freeze() - 128)*self->radius / 128;
		double zo = (pr_freeze()*self->Height / 255);

		mo = Spawn("IceChunk", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->SetState (mo->SpawnState + (pr_freeze()%3));
			mo->Vel.X = pr_freeze.Random2() / 128.;
			mo->Vel.Y = pr_freeze.Random2() / 128.;
			mo->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;
			CALL_ACTION(A_IceSetTics, mo); // set a random tic wait
			mo->RenderStyle = self->RenderStyle;
			mo->Alpha = self->Alpha;
		}
	}
	if (self->player)
	{ // attach the player's view to a chunk of ice
		AActor *head = Spawn("IceChunkHead", self->PosPlusZ(self->player->mo->ViewHeight), ALLOW_REPLACE);
		if (head != NULL)
		{
			head->Vel.X = pr_freeze.Random2() / 128.;
			head->Vel.Y = pr_freeze.Random2() / 128.;
			head->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;

			head->health = self->health;
			head->Angles.Yaw = self->Angles.Yaw;
			if (head->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
			{
				head->player = self->player;
				head->player->mo = static_cast<APlayerPawn*>(head);
				self->player = NULL;
				head->ObtainInventory (self);
			}
			head->Angles.Pitch = 0.;
			head->RenderStyle = self->RenderStyle;
			head->Alpha = self->Alpha;
			if (head->player->camera == self)
			{
				head->player->camera = head;
			}
		}
	}

	// [RH] Do some stuff to make this more useful outside Hexen
	if (self->flags4 & MF4_BOSSDEATH)
	{
		A_BossDeath(self);
	}
	A_Unblock(self, true);

	self->SetState(self->FindState(NAME_Null));
	return 0;
}